

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxFileSystem.cpp
# Opt level: O2

bool Diligent::LinuxFileSystem::CreateDirectory(Char *strPath)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  bool bVar5;
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> subPath;
  
  if ((strPath == (Char *)0x0) || (*strPath == '\0')) {
    FormatString<char[31]>(&path,(char (*) [31])"Path must not be null or empty");
    DebugAssertionFailed
              (path._M_dataplus._M_p,"CreateDirectory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Platforms/Linux/src/LinuxFileSystem.cpp"
               ,0x58);
    std::__cxx11::string::~string((string *)&path);
    bVar5 = false;
  }
  else {
    std::__cxx11::string::string((string *)&path,strPath,(allocator *)&subPath);
    BasicFileSystem::CorrectSlashes(&path,'\0');
    lVar3 = 0;
    while (bVar5 = lVar3 == -1, !bVar5) {
      lVar3 = std::__cxx11::string::find((char)&path,0x2f);
      std::__cxx11::string::substr((ulong)&subPath,(ulong)&path);
      bVar1 = PathExists(subPath._M_dataplus._M_p);
      if (!bVar1) {
        iVar2 = mkdir(subPath._M_dataplus._M_p,0x1ff);
        if (iVar2 != 0) {
          piVar4 = __errno_location();
          if (*piVar4 != 0x11) {
            std::__cxx11::string::~string((string *)&subPath);
            break;
          }
        }
      }
      std::__cxx11::string::~string((string *)&subPath);
    }
    std::__cxx11::string::~string((string *)&path);
  }
  return bVar5;
}

Assistant:

bool LinuxFileSystem::CreateDirectory(const Char* strPath)
{
    if (strPath == nullptr || strPath[0] == '\0')
    {
        UNEXPECTED("Path must not be null or empty");
        return false;
    }

    std::string path = strPath;
    CorrectSlashes(path);

    size_t position = 0;
    while (position != std::string::npos)
    {
        position     = path.find(SlashSymbol, position + 1);
        auto subPath = path.substr(0, position);
        if (!PathExists(subPath.c_str()))
        {
            if (mkdir(subPath.c_str(), S_IRWXU | S_IRWXG | S_IRWXO) != 0)
            {
                // If multiple threads are trying to create the same directory, it is possible
                // that the directory has been created by another thread, which is OK.
                if (errno != EEXIST)
                    return false;
            }
        }
    }
    return true;
}